

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_goaway
              (nghttp2_session *session,uint8_t flags,int32_t last_stream_id,uint32_t error_code,
              uint8_t *opaque_data,size_t opaque_data_len)

{
  size_t opaque_data_len_local;
  uint8_t *opaque_data_local;
  uint32_t error_code_local;
  int32_t last_stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if ((session->goaway_flags & 1) == 0) {
    session_local._4_4_ =
         nghttp2_session_add_goaway
                   (session,last_stream_id,error_code,opaque_data,opaque_data_len,'\0');
  }
  else {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_goaway(nghttp2_session *session, uint8_t flags,
                          int32_t last_stream_id, uint32_t error_code,
                          const uint8_t *opaque_data, size_t opaque_data_len) {
  (void)flags;

  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_ON_SEND) {
    return 0;
  }
  return nghttp2_session_add_goaway(session, last_stream_id, error_code,
                                    opaque_data, opaque_data_len,
                                    NGHTTP2_GOAWAY_AUX_NONE);
}